

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O3

void __thiscall CGraphics_Threaded::FlushVertices(CGraphics_Threaded *this)

{
  int iVar1;
  uint uVar2;
  uchar *puVar3;
  bool bVar4;
  long lVar5;
  int iVar6;
  CCommandBuffer *pCVar7;
  char *fmt;
  ulong uVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  CRenderCommand local_78;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = this->m_NumVertices;
  if (iVar1 == 0) goto LAB_00125c1a;
  this->m_NumVertices = 0;
  local_78.super_CCommand.m_Cmd = 7;
  local_78.super_CCommand.m_pNext = (CCommand *)0x0;
  local_78.m_State.m_BlendMode = (this->m_State).m_BlendMode;
  local_78.m_State.m_WrapModeU = (this->m_State).m_WrapModeU;
  local_78.m_State.m_WrapModeV = (this->m_State).m_WrapModeV;
  local_78.m_State.m_Texture = (this->m_State).m_Texture;
  local_78.m_State.m_TextureArrayIndex = (this->m_State).m_TextureArrayIndex;
  local_78.m_State.m_Dimension = (this->m_State).m_Dimension;
  local_78.m_State.m_ScreenTL.x = (this->m_State).m_ScreenTL.x;
  local_78.m_State.m_ScreenTL.y = (this->m_State).m_ScreenTL.y;
  local_78.m_State.m_ScreenBR.x = (this->m_State).m_ScreenBR.x;
  local_78.m_State.m_ScreenBR.y = (this->m_State).m_ScreenBR.y;
  local_78.m_State.m_ClipEnable = (this->m_State).m_ClipEnable;
  local_78.m_State._41_3_ = *(undefined3 *)&(this->m_State).field_0x29;
  local_78.m_State.m_ClipX = (this->m_State).m_ClipX;
  local_78.m_State.m_ClipY = (this->m_State).m_ClipY;
  local_78.m_State.m_ClipW = (this->m_State).m_ClipW;
  local_78.m_State.m_ClipH = (this->m_State).m_ClipH;
  if (this->m_Drawing == 1) {
    iVar6 = 4;
    local_78.m_PrimType = 2;
  }
  else {
    if (this->m_Drawing != 2) goto LAB_00125c1a;
    iVar6 = 2;
    local_78.m_PrimType = 1;
  }
  local_78.m_PrimCount = iVar1 / iVar6;
  pCVar7 = this->m_pCommandBuffer;
  uVar9 = (ulong)(uint)(iVar1 * 0x24);
  puVar3 = (pCVar7->m_DataBuffer).m_pData;
  uVar2 = (pCVar7->m_DataBuffer).m_Used;
  lVar5 = 8 - (ulong)((int)puVar3 + uVar2 & 7);
  uVar8 = uVar2 + uVar9 + lVar5;
  if ((pCVar7->m_DataBuffer).m_Size < uVar8) {
    local_78.m_pVertices = (CVertex *)0x0;
LAB_00125af6:
    (*this->m_pBackend->_vptr_IGraphicsBackend[0x11])();
    uVar8 = (ulong)this->m_CurrentCommandBuffer ^ 1;
    this->m_CurrentCommandBuffer = (uint)uVar8;
    pCVar7 = this->m_apCommandBuffers[uVar8];
    this->m_pCommandBuffer = pCVar7;
    (pCVar7->m_CmdBuffer).m_Used = 0;
    *(undefined8 *)&(pCVar7->m_DataBuffer).m_Used = 0;
    *(undefined8 *)((long)&pCVar7->m_pCmdBufferHead + 4) = 0;
    *(undefined4 *)((long)&pCVar7->m_pCmdBufferTail + 4) = 0;
    pCVar7 = this->m_pCommandBuffer;
    puVar3 = (pCVar7->m_DataBuffer).m_pData;
    uVar2 = (pCVar7->m_DataBuffer).m_Used;
    lVar5 = 8 - (ulong)((int)puVar3 + uVar2 & 7);
    uVar8 = uVar2 + uVar9 + lVar5;
    if ((pCVar7->m_DataBuffer).m_Size < uVar8) {
LAB_00125bfc:
      local_78.m_pVertices = (CVertex *)0x0;
    }
    else {
      (pCVar7->m_DataBuffer).m_Used = (uint)uVar8;
      local_78.m_pVertices = (CVertex *)(puVar3 + (ulong)uVar2 + lVar5);
      if (local_78.m_pVertices != (CVertex *)0x0) goto LAB_00125b6c;
    }
LAB_00125c05:
    fmt = "failed to allocate data for vertices";
  }
  else {
    (pCVar7->m_DataBuffer).m_Used = (uint)uVar8;
    local_78.m_pVertices = (CVertex *)(puVar3 + (ulong)uVar2 + lVar5);
    if (local_78.m_pVertices == (CVertex *)0x0) goto LAB_00125af6;
LAB_00125b6c:
    bVar4 = CCommandBuffer::AddCommand<CCommandBuffer::CRenderCommand>(pCVar7,&local_78);
    if (bVar4) {
LAB_00125b7e:
      mem_copy(local_78.m_pVertices,this->m_aVertices,iVar1 * 0x24);
      goto LAB_00125c1a;
    }
    (*this->m_pBackend->_vptr_IGraphicsBackend[0x11])(this->m_pBackend,this->m_pCommandBuffer);
    uVar8 = (ulong)this->m_CurrentCommandBuffer ^ 1;
    this->m_CurrentCommandBuffer = (uint)uVar8;
    pCVar7 = this->m_apCommandBuffers[uVar8];
    this->m_pCommandBuffer = pCVar7;
    (pCVar7->m_CmdBuffer).m_Used = 0;
    *(undefined8 *)&(pCVar7->m_DataBuffer).m_Used = 0;
    *(undefined8 *)((long)&pCVar7->m_pCmdBufferHead + 4) = 0;
    *(undefined4 *)((long)&pCVar7->m_pCmdBufferTail + 4) = 0;
    pCVar7 = this->m_pCommandBuffer;
    puVar3 = (pCVar7->m_DataBuffer).m_pData;
    uVar2 = (pCVar7->m_DataBuffer).m_Used;
    lVar5 = 8 - (ulong)((int)puVar3 + uVar2 & 7);
    uVar8 = uVar2 + uVar9 + lVar5;
    if ((pCVar7->m_DataBuffer).m_Size < uVar8) goto LAB_00125bfc;
    (pCVar7->m_DataBuffer).m_Used = (uint)uVar8;
    local_78.m_pVertices = (CVertex *)(puVar3 + (ulong)uVar2 + lVar5);
    if (local_78.m_pVertices == (CVertex *)0x0) goto LAB_00125c05;
    bVar4 = CCommandBuffer::AddCommand<CCommandBuffer::CRenderCommand>(pCVar7,&local_78);
    if (bVar4) goto LAB_00125b7e;
    fmt = "failed to allocate memory for render command";
  }
  dbg_msg("graphics",fmt);
LAB_00125c1a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CGraphics_Threaded::FlushVertices()
{
	if(m_NumVertices == 0)
		return;

	int NumVerts = m_NumVertices;
	m_NumVertices = 0;

	CCommandBuffer::CRenderCommand Cmd;
	Cmd.m_State = m_State;

	if(m_Drawing == DRAWING_QUADS)
	{
		Cmd.m_PrimType = CCommandBuffer::PRIMTYPE_QUADS;
		Cmd.m_PrimCount = NumVerts/4;
	}
	else if(m_Drawing == DRAWING_LINES)
	{
		Cmd.m_PrimType = CCommandBuffer::PRIMTYPE_LINES;
		Cmd.m_PrimCount = NumVerts/2;
	}
	else
		return;

	Cmd.m_pVertices = (CCommandBuffer::CVertex *)m_pCommandBuffer->AllocData(sizeof(CCommandBuffer::CVertex)*NumVerts);
	if(Cmd.m_pVertices == 0x0)
	{
		// kick command buffer and try again
		KickCommandBuffer();

		Cmd.m_pVertices = (CCommandBuffer::CVertex *)m_pCommandBuffer->AllocData(sizeof(CCommandBuffer::CVertex)*NumVerts);
		if(Cmd.m_pVertices == 0x0)
		{
			dbg_msg("graphics", "failed to allocate data for vertices");
			return;
		}
	}

	// check if we have enough free memory in the commandbuffer
	if(!m_pCommandBuffer->AddCommand(Cmd))
	{
		// kick command buffer and try again
		KickCommandBuffer();

		Cmd.m_pVertices = (CCommandBuffer::CVertex *)m_pCommandBuffer->AllocData(sizeof(CCommandBuffer::CVertex)*NumVerts);
		if(Cmd.m_pVertices == 0x0)
		{
			dbg_msg("graphics", "failed to allocate data for vertices");
			return;
		}

		if(!m_pCommandBuffer->AddCommand(Cmd))
		{
			dbg_msg("graphics", "failed to allocate memory for render command");
			return;
		}
	}

	mem_copy(Cmd.m_pVertices, m_aVertices, sizeof(CCommandBuffer::CVertex)*NumVerts);
}